

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

void __thiscall libDAI::JTree::runShaferShenoy(JTree *this)

{
  pointer pDVar1;
  size_t sVar2;
  size_t i1;
  long lVar3;
  pointer pTVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Factor *pFVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar7;
  long lVar8;
  size_t *psVar9;
  long lVar10;
  size_t e;
  size_t sVar11;
  ulong uVar12;
  size_t alpha;
  bool bVar13;
  double dVar14;
  Factor piet;
  TFactor<double> local_68;
  
  this->_logZ = 0.0;
  sVar11 = (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  while (bVar13 = sVar11 != 0, sVar11 = sVar11 - 1, bVar13) {
    pDVar1 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar2 = pDVar1[sVar11].n1;
    i1 = pDVar1[sVar11].n2;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&piet,(TFactor<double> *)(i1 * 0x40 + *(long *)(CONCAT44(extraout_var,iVar5) + 0xe0))
              );
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    psVar9 = *(size_t **)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x140) + i1 * 0x18);
    while( true ) {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if (psVar9 == *(size_t **)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x140) + 8 + i1 * 0x18)
         ) break;
      if (*psVar9 != sVar11) {
        pFVar6 = message(this,i1,*psVar9);
        TFactor<double>::operator*=(&piet,pFVar6);
      }
      psVar9 = psVar9 + 1;
    }
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::partSum
              (&local_68,&piet,
               (VarSet *)(sVar11 * 0x28 + *(long *)(CONCAT44(extraout_var_02,iVar5) + 0xf8)));
    pFVar6 = message(this,sVar2,sVar11);
    TFactor<double>::operator=(pFVar6,&local_68);
    TFactor<double>::~TFactor(&local_68);
    pFVar6 = message(this,sVar2,sVar11);
    dVar14 = TProb<double>::normalize(&pFVar6->_p,NORMPROB);
    dVar14 = log(dVar14);
    this->_logZ = dVar14 + this->_logZ;
    TFactor<double>::~TFactor(&piet);
  }
  for (uVar12 = 0;
      pDVar1 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this->_RTree).
                             super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 4);
      uVar12 = uVar12 + 1) {
    sVar11 = pDVar1[uVar12].n1;
    sVar2 = pDVar1[uVar12].n2;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&piet,(TFactor<double> *)
                     (sVar11 * 0x40 + *(long *)(CONCAT44(extraout_var_03,iVar5) + 0xe0)));
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    psVar9 = *(size_t **)(*(long *)(CONCAT44(extraout_var_04,iVar5) + 0x140) + sVar11 * 0x18);
    while( true ) {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if (psVar9 == *(size_t **)
                     (*(long *)(CONCAT44(extraout_var_05,iVar5) + 0x140) + 8 + sVar11 * 0x18))
      break;
      if (*psVar9 != uVar12) {
        pFVar6 = message(this,sVar11,*psVar9);
        TFactor<double>::operator*=(&piet,pFVar6);
      }
      psVar9 = psVar9 + 1;
    }
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::marginal
              (&local_68,&piet,
               (VarSet *)(uVar12 * 0x28 + *(long *)(CONCAT44(extraout_var_06,iVar5) + 0xf8)),true);
    pFVar6 = message(this,sVar2,uVar12);
    TFactor<double>::operator=(pFVar6,&local_68);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::~TFactor(&piet);
  }
  uVar12 = 0;
  while( true ) {
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_07,iVar5) + 0xe8) -
                *(long *)(CONCAT44(extraout_var_07,iVar5) + 0xe0) >> 6) <= uVar12) break;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::TFactor
              (&piet,(TFactor<double> *)
                     (uVar12 * 0x40 + *(long *)(CONCAT44(extraout_var_08,iVar5) + 0xe0)));
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    psVar9 = *(size_t **)(*(long *)(CONCAT44(extraout_var_09,iVar5) + 0x140) + uVar12 * 0x18);
    while( true ) {
      iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if (psVar9 == *(size_t **)
                     (*(long *)(CONCAT44(extraout_var_10,iVar5) + 0x140) + 8 + uVar12 * 0x18))
      break;
      pFVar6 = message(this,uVar12,*psVar9);
      TFactor<double>::operator*=(&piet,pFVar6);
      psVar9 = psVar9 + 1;
    }
    pDVar1 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pDVar1 == (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish) || (uVar12 == pDVar1->n1)) {
      dVar14 = TProb<double>::normalize(&piet._p,NORMPROB);
      dVar14 = log(dVar14);
      this->_logZ = dVar14 + this->_logZ;
      TFactor<double>::operator=
                ((this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,&piet);
    }
    else {
      TFactor<double>::normalized(&local_68,&piet,NORMPROB);
      TFactor<double>::operator=
                ((this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,&local_68);
      TFactor<double>::~TFactor(&local_68);
    }
    TFactor<double>::~TFactor(&piet);
    uVar12 = uVar12 + 1;
  }
  lVar7 = 0;
  lVar10 = 0;
  lVar8 = 0;
  uVar12 = 0;
  while( true ) {
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var_11,iVar5) + 0x100) -
                *(long *)(CONCAT44(extraout_var_11,iVar5) + 0xf8)) / 0x28) <= uVar12) break;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    lVar3 = **(long **)(*(long *)(CONCAT44(extraout_var_12,iVar5) + 0x158) + lVar7);
    pTVar4 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar5 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    TFactor<double>::marginal
              (&piet,pTVar4 + lVar3,
               (VarSet *)(*(long *)(CONCAT44(extraout_var_13,iVar5) + 0xf8) + lVar10),true);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_Qb).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8),&piet);
    TFactor<double>::~TFactor(&piet);
    uVar12 = uVar12 + 1;
    lVar8 = lVar8 + 0x38;
    lVar10 = lVar10 + 0x28;
    lVar7 = lVar7 + 0x18;
  }
  return;
}

Assistant:

void JTree::runShaferShenoy() {
        // First pass
        _logZ = 0.0;
        for( size_t e = _RTree.size(); (e--) != 0; ) {
            // send a message from _RTree[e].n2 to _RTree[e].n1
            // or, actually, from the seperator IR(e) to _RTree[e].n1

            size_t i = _RTree[e].n2;
            size_t j = _RTree[e].n1;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.partSum( grm().IR(e) );
            _logZ += log( message(j,e).normalize() );
        }

        // Second pass
        for( size_t e = 0; e < _RTree.size(); e++ ) {
            size_t i = _RTree[e].n1;
            size_t j = _RTree[e].n2;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.marginal( grm().IR(e) );
        }

        // Calculate beliefs
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            Factor piet = grm().OR(alpha);
            for( RegionGraph::R_nb_cit k = grm().nbOR(alpha).begin(); k != grm().nbOR(alpha).end(); k++ )
                piet *= message( alpha, *k );
            if( _RTree.empty() ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else if( alpha == _RTree[0].n1 ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else
                _Qa[alpha] = piet.normalized();
        }

        // Only for logZ (and for belief)...
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb[beta] = _Qa[grm().nbIR(beta)[0]].marginal( grm().IR(beta) );
    }